

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O2

string * __thiscall
MADPComponentFactoredStates::SoftPrintState_abi_cxx11_
          (string *__return_storage_ptr__,MADPComponentFactoredStates *this,Index sI)

{
  pointer puVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s_vec;
  stringstream ss;
  stringstream ss_1;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_520;
  string local_508 [32];
  string local_4e8 [32];
  stringstream local_4c8 [16];
  ostream local_4b8 [376];
  stringstream local_340 [16];
  ostream local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_4c8);
  StateIndexToFactorValueIndices
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_520,this,sI);
  std::__cxx11::stringstream::stringstream(local_340);
  puVar1 = local_520._M_impl.super__Vector_impl_data._M_start;
  std::operator<<(local_330,"< ");
  for (; puVar1 != local_520._M_impl.super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
    if (puVar1 != local_520._M_impl.super__Vector_impl_data._M_start) {
      std::operator<<(local_330,", ");
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::operator<<(local_330,local_4e8);
    std::__cxx11::string::~string(local_4e8);
  }
  std::operator<<(local_330," >");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  std::operator<<(local_4b8,local_508);
  std::__cxx11::string::~string(local_508);
  std::__cxx11::stringbuf::str();
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_520);
  std::__cxx11::stringstream::~stringstream(local_4c8);
  return __return_storage_ptr__;
}

Assistant:

string MADPComponentFactoredStates::SoftPrintState(Index sI) const
{
    stringstream ss;
    vector<Index> s_vec = StateIndexToFactorValueIndices(sI);
    ss << SoftPrintVector(s_vec);
    return(ss.str());
    
}